

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O3

int err_string_cmp(void *a,void *b)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*b >> 0xf <= *a >> 0xf) {
    uVar1 = (uint)(*b >> 0xf < *a >> 0xf);
  }
  return uVar1;
}

Assistant:

static int err_string_cmp(const void *a, const void *b) {
  const uint32_t a_key = *((const uint32_t *)a) >> 15;
  const uint32_t b_key = *((const uint32_t *)b) >> 15;

  if (a_key < b_key) {
    return -1;
  } else if (a_key > b_key) {
    return 1;
  } else {
    return 0;
  }
}